

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

bool ParseFixedPoint(string_view val,int decimals,int64_t *amount_out)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  char cVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long in_FS_OFFSET;
  int mantissa_tzeros;
  int local_44;
  int64_t local_40;
  long local_38;
  
  pcVar4 = val._M_str;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  local_44 = 0;
  uVar5 = 0;
  iVar10 = (int)val._M_len;
  if (0 < iVar10) {
    uVar5 = (ulong)(*pcVar4 == '-');
  }
  if ((int)uVar5 < iVar10) {
    cVar7 = (char)uVar5;
    if (pcVar4[uVar5] == '0') {
      uVar5 = (ulong)((int)uVar5 + 1);
LAB_00af3339:
      iVar2 = (int)uVar5;
      if ((iVar2 < iVar10) && (pcVar4[iVar2] == '.')) {
        uVar8 = (long)iVar2 + 1;
        if ((iVar10 <= (int)uVar8) || (9 < (byte)(pcVar4[uVar8] - 0x30U))) goto LAB_00af3571;
        lVar9 = 0;
        for (; (uVar5 = val._M_len, (long)uVar8 < (long)iVar10 &&
               (uVar5 = uVar8, (byte)(pcVar4[uVar8] - 0x30U) < 10)); uVar8 = uVar8 + 1) {
          bVar1 = ProcessMantissaDigit(pcVar4[uVar8],&local_40,&local_44);
          if (!bVar1) goto LAB_00af3571;
          lVar9 = lVar9 + 1;
        }
        uVar5 = uVar5 & 0xffffffff;
      }
      else {
        lVar9 = 0;
      }
      iVar2 = (int)uVar5;
      if ((iVar2 < iVar10) && ((byte)(pcVar4[iVar2] | 0x20U) == 0x65)) {
        uVar5 = (long)iVar2 + 1;
        if ((int)uVar5 < iVar10) {
          uVar8 = (ulong)(iVar2 + 2);
          if (pcVar4[uVar5] == '+') {
            bVar1 = false;
          }
          else {
            bVar1 = pcVar4[uVar5] == '-';
            if (!bVar1) {
              uVar8 = uVar5 & 0xffffffff;
            }
          }
        }
        else {
          bVar1 = false;
          uVar8 = uVar5;
        }
        if (((int)uVar8 < iVar10) && (uVar5 = (ulong)(int)uVar8, (byte)(pcVar4[uVar5] - 0x30U) < 10)
           ) {
          lVar6 = 0;
          for (; (long)uVar5 < (long)iVar10; uVar5 = uVar5 + 1) {
            if (9 < (byte)(pcVar4[uVar5] - 0x30U)) goto LAB_00af344d;
            if (99999999999999999 < lVar6) goto LAB_00af3571;
            lVar6 = lVar6 * 10 + (ulong)(byte)pcVar4[uVar5] + -0x30;
          }
LAB_00af3456:
          lVar3 = -lVar6;
          if (!bVar1) {
            lVar3 = lVar6;
          }
          goto LAB_00af3477;
        }
      }
      else {
        lVar6 = 0;
        bVar1 = false;
LAB_00af344d:
        if ((int)uVar5 == iVar10) goto LAB_00af3456;
      }
    }
    else if ((byte)(pcVar4[uVar5] - 0x31U) < 9) {
      for (; (val._M_len & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
        if (9 < (byte)(pcVar4[uVar5] - 0x30U)) {
          uVar5 = uVar5 & 0xffffffff;
          goto LAB_00af3339;
        }
        bVar1 = ProcessMantissaDigit(pcVar4[uVar5],&local_40,&local_44);
        if (!bVar1) goto LAB_00af3571;
      }
      lVar9 = 0;
      lVar3 = 0;
LAB_00af3477:
      if (cVar7 != '\0') {
        local_40 = -local_40;
      }
      uVar5 = (decimals - lVar9) + lVar3 + (long)local_44;
      lVar3 = local_40;
      if (uVar5 < 0x12) {
        while (bVar1 = uVar5 != 0, uVar5 = uVar5 - 1, bVar1) {
          if (lVar3 + 0xfe9cba87a2760000U < 0xfd39750f44ec0001) goto LAB_00af3571;
          lVar3 = lVar3 * 10;
        }
        if (0xe43e9298b1380000 < lVar3 + 0xf21f494c589c0000U) {
          bVar1 = true;
          if (amount_out != (int64_t *)0x0) {
            *amount_out = lVar3;
          }
          goto LAB_00af3573;
        }
      }
    }
  }
LAB_00af3571:
  bVar1 = false;
LAB_00af3573:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool ParseFixedPoint(std::string_view val, int decimals, int64_t *amount_out)
{
    int64_t mantissa = 0;
    int64_t exponent = 0;
    int mantissa_tzeros = 0;
    bool mantissa_sign = false;
    bool exponent_sign = false;
    int ptr = 0;
    int end = val.size();
    int point_ofs = 0;

    if (ptr < end && val[ptr] == '-') {
        mantissa_sign = true;
        ++ptr;
    }
    if (ptr < end)
    {
        if (val[ptr] == '0') {
            /* pass single 0 */
            ++ptr;
        } else if (val[ptr] >= '1' && val[ptr] <= '9') {
            while (ptr < end && IsDigit(val[ptr])) {
                if (!ProcessMantissaDigit(val[ptr], mantissa, mantissa_tzeros))
                    return false; /* overflow */
                ++ptr;
            }
        } else return false; /* missing expected digit */
    } else return false; /* empty string or loose '-' */
    if (ptr < end && val[ptr] == '.')
    {
        ++ptr;
        if (ptr < end && IsDigit(val[ptr]))
        {
            while (ptr < end && IsDigit(val[ptr])) {
                if (!ProcessMantissaDigit(val[ptr], mantissa, mantissa_tzeros))
                    return false; /* overflow */
                ++ptr;
                ++point_ofs;
            }
        } else return false; /* missing expected digit */
    }
    if (ptr < end && (val[ptr] == 'e' || val[ptr] == 'E'))
    {
        ++ptr;
        if (ptr < end && val[ptr] == '+')
            ++ptr;
        else if (ptr < end && val[ptr] == '-') {
            exponent_sign = true;
            ++ptr;
        }
        if (ptr < end && IsDigit(val[ptr])) {
            while (ptr < end && IsDigit(val[ptr])) {
                if (exponent > (UPPER_BOUND / 10LL))
                    return false; /* overflow */
                exponent = exponent * 10 + val[ptr] - '0';
                ++ptr;
            }
        } else return false; /* missing expected digit */
    }
    if (ptr != end)
        return false; /* trailing garbage */

    /* finalize exponent */
    if (exponent_sign)
        exponent = -exponent;
    exponent = exponent - point_ofs + mantissa_tzeros;

    /* finalize mantissa */
    if (mantissa_sign)
        mantissa = -mantissa;

    /* convert to one 64-bit fixed-point value */
    exponent += decimals;
    if (exponent < 0)
        return false; /* cannot represent values smaller than 10^-decimals */
    if (exponent >= 18)
        return false; /* cannot represent values larger than or equal to 10^(18-decimals) */

    for (int i=0; i < exponent; ++i) {
        if (mantissa > (UPPER_BOUND / 10LL) || mantissa < -(UPPER_BOUND / 10LL))
            return false; /* overflow */
        mantissa *= 10;
    }
    if (mantissa > UPPER_BOUND || mantissa < -UPPER_BOUND)
        return false; /* overflow */

    if (amount_out)
        *amount_out = mantissa;

    return true;
}